

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void WriteDest(void)

{
  size_t sVar1;
  aint local_14;
  int local_10;
  int i;
  int write_length;
  
  if (WBLength != 0) {
    destlen = WBLength + destlen;
    if ((FP_Output != (FILE *)0x0) &&
       (sVar1 = fwrite(WriteBuffer,1,(long)WBLength,(FILE *)FP_Output), (int)sVar1 != WBLength)) {
      Error("Write error (disk full?)",(char *)0x0,FATAL);
    }
    if ((FP_RAW != (FILE *)0x0) &&
       (sVar1 = fwrite(WriteBuffer,1,(long)WBLength,(FILE *)FP_RAW), (int)sVar1 != WBLength)) {
      Error("Write error (disk full?)",(char *)0x0,FATAL);
    }
    if (FP_tapout != (FILE *)0x0) {
      if (tape_length + WBLength < 0x10000) {
        local_14 = WBLength;
      }
      else {
        local_14 = 0xffff - tape_length;
      }
      sVar1 = fwrite(WriteBuffer,1,(long)local_14,(FILE *)FP_tapout);
      if ((int)sVar1 != local_14) {
        Error("Write error (disk full?)",(char *)0x0,FATAL);
      }
      for (local_10 = 0; local_10 < local_14; local_10 = local_10 + 1) {
        tape_parity = WriteBuffer[local_10] ^ tape_parity;
      }
      tape_length = local_14 + tape_length;
      if (local_14 < WBLength) {
        WBLength = 0;
        CloseTapFile();
        Error("Tape block exceeds maximal size",(char *)0x0,PASS3);
      }
    }
    WBLength = 0;
  }
  return;
}

Assistant:

void WriteDest() {
	if (!WBLength) {
		return;
	}
	destlen += WBLength;
	if (FP_Output != NULL && (aint) fwrite(WriteBuffer, 1, WBLength, FP_Output) != WBLength) {
		Error("Write error (disk full?)", NULL, FATAL);
	}
	if (FP_RAW != NULL && (aint) fwrite(WriteBuffer, 1, WBLength, FP_RAW) != WBLength) {
		Error("Write error (disk full?)", NULL, FATAL);
	}

	if (FP_tapout)
	{
		int write_length = tape_length + WBLength > 65535 ? 65535 - tape_length : WBLength;

		if ( (aint)fwrite(WriteBuffer, 1, write_length, FP_tapout) != write_length) Error("Write error (disk full?)", NULL, FATAL);

		for (int i = 0; i < write_length; i++) tape_parity ^= WriteBuffer[i];
		tape_length += write_length;

		if (write_length < WBLength)
		{
			WBLength = 0;
			CloseTapFile();
			Error("Tape block exceeds maximal size");
		}
	}
	WBLength = 0;
}